

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  LogMessage *other;
  int iVar1;
  char *pcVar2;
  long lVar3;
  pair<const_char_*,_bool> pVar4;
  LogMessage local_70;
  int local_38;
  LogFinisher local_31;
  
  pcVar2 = this->buffer_end_;
  if ((long)size <= (long)(pcVar2 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar2 = this->buffer_end_;
  }
  iVar1 = ((int)pcVar2 - (int)ptr) + 0x10;
  do {
    local_38 = size - iVar1;
    if (local_38 == 0 || size < iVar1) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/parse_context.h"
                 ,0x12a);
      other = LogMessage::operator<<(&local_70,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_31,other);
      LogMessage::~LogMessage(&local_70);
    }
    std::__cxx11::string::append((char *)str,(ulong)ptr);
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar4 = DoneFallback(this,ptr + iVar1,-1);
    ptr = pVar4.first;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)0x0;
    }
    iVar1 = (*(int *)&this->buffer_end_ - (int)pVar4.first) + 0x10;
    size = local_38;
  } while (iVar1 < local_38);
  lVar3 = (long)local_38;
  std::__cxx11::string::append((char *)str,(ulong)ptr);
  return ptr + lVar3;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}